

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O1

str_t * newstr(upb_DefBuilder *ctx,char *data,size_t len)

{
  upb_Arena *a;
  str_t *psVar1;
  ulong size;
  
  if (len == 0xfffffffffffffff0) {
    psVar1 = (str_t *)0x0;
  }
  else {
    a = ctx->arena;
    size = len + 0x17 & 0xfffffffffffffff8;
    psVar1 = (str_t *)a->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)psVar1) < size) {
      psVar1 = (str_t *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
    }
    else {
      if ((str_t *)((ulong)((long)&psVar1->len + 7U) & 0xfffffffffffffff8) != psVar1) {
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/upb/mem/internal/arena.h"
                      ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      a->ptr_dont_copy_me__upb_internal_use_only = psVar1->str + (size - 8);
    }
    if (psVar1 == (str_t *)0x0) goto LAB_00121542;
  }
  if (psVar1 != (str_t *)0x0) {
    psVar1->len = len;
    if (len != 0) {
      memcpy(psVar1->str,data,len);
    }
    psVar1->str[len] = '\0';
    return psVar1;
  }
LAB_00121542:
  _upb_DefBuilder_OomErr(ctx);
}

Assistant:

static str_t* newstr(upb_DefBuilder* ctx, const char* data, size_t len) {
  str_t* ret = _upb_DefBuilder_Alloc(ctx, sizeof(*ret) + len);
  if (!ret) _upb_DefBuilder_OomErr(ctx);
  ret->len = len;
  if (len) memcpy(ret->str, data, len);
  ret->str[len] = '\0';
  return ret;
}